

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5AsciiCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  byte bVar1;
  char *zLeft;
  int iVar2;
  Fts5Tokenizer *__dest;
  long lVar3;
  byte *pbVar4;
  
  iVar2 = 1;
  if ((nArg & 1U) == 0) {
    iVar2 = sqlite3_initialize();
    if ((iVar2 == 0) &&
       (__dest = (Fts5Tokenizer *)sqlite3Malloc(0x80), __dest != (Fts5Tokenizer *)0x0)) {
      memcpy(__dest,"",0x80);
      if (nArg < 1) {
        iVar2 = 0;
      }
      else {
        lVar3 = 0;
        do {
          zLeft = azArg[lVar3];
          if (zLeft == (char *)0x0) {
LAB_001b0f81:
            sqlite3_free(__dest);
            __dest = (Fts5Tokenizer *)0x0;
            iVar2 = 1;
            goto LAB_001b0ea8;
          }
          pbVar4 = (byte *)azArg[lVar3 + 1];
          iVar2 = sqlite3StrICmp(zLeft,"tokenchars");
          if (iVar2 == 0) {
            bVar1 = *pbVar4;
            while (bVar1 != 0) {
              pbVar4 = pbVar4 + 1;
              if (-1 < (char)bVar1) {
                __dest[bVar1] = (Fts5Tokenizer)0x1;
              }
              bVar1 = *pbVar4;
            }
          }
          else {
            iVar2 = sqlite3StrICmp(zLeft,"separators");
            if (iVar2 != 0) goto LAB_001b0f81;
            bVar1 = *pbVar4;
            while (bVar1 != 0) {
              pbVar4 = pbVar4 + 1;
              if (-1 < (char)bVar1) {
                __dest[bVar1] = (Fts5Tokenizer)0x0;
              }
              bVar1 = *pbVar4;
            }
          }
          lVar3 = lVar3 + 2;
        } while ((int)lVar3 < nArg);
        iVar2 = 0;
      }
    }
    else {
      __dest = (Fts5Tokenizer *)0x0;
      iVar2 = 7;
    }
  }
  else {
    __dest = (Fts5Tokenizer *)0x0;
  }
LAB_001b0ea8:
  *ppOut = __dest;
  return iVar2;
}

Assistant:

static int fts5AsciiCreate(
  void *pUnused, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;
  AsciiTokenizer *p = 0;
  UNUSED_PARAM(pUnused);
  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = sqlite3_malloc(sizeof(AsciiTokenizer));
    if( p==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int i;
      memset(p, 0, sizeof(AsciiTokenizer));
      memcpy(p->aTokenChar, aAsciiTokenChar, sizeof(aAsciiTokenChar));
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          fts5AsciiAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          fts5AsciiAddExceptions(p, zArg, 0);
        }else{
          rc = SQLITE_ERROR;
        }
      }
      if( rc!=SQLITE_OK ){
        fts5AsciiDelete((Fts5Tokenizer*)p);
        p = 0;
      }
    }
  }

  *ppOut = (Fts5Tokenizer*)p;
  return rc;
}